

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::WeightParams::InternalSwap(WeightParams *this,WeightParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  void *pvVar3;
  QuantizationParams *pQVar4;
  long __tmp;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::RepeatedField<float>::InternalSwap(&this->floatvalue_,&other->floatvalue_);
  pvVar3 = (other->float16value_).tagged_ptr_.ptr_;
  (other->float16value_).tagged_ptr_.ptr_ = (this->float16value_).tagged_ptr_.ptr_;
  (this->float16value_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->rawvalue_).tagged_ptr_.ptr_;
  (other->rawvalue_).tagged_ptr_.ptr_ = (this->rawvalue_).tagged_ptr_.ptr_;
  (this->rawvalue_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->int8rawvalue_).tagged_ptr_.ptr_;
  (other->int8rawvalue_).tagged_ptr_.ptr_ = (this->int8rawvalue_).tagged_ptr_.ptr_;
  (this->int8rawvalue_).tagged_ptr_.ptr_ = pvVar3;
  pQVar4 = this->quantization_;
  this->quantization_ = other->quantization_;
  other->quantization_ = pQVar4;
  bVar1 = this->isupdatable_;
  this->isupdatable_ = other->isupdatable_;
  other->isupdatable_ = bVar1;
  return;
}

Assistant:

void WeightParams::InternalSwap(WeightParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  floatvalue_.InternalSwap(&other->floatvalue_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &float16value_, lhs_arena,
      &other->float16value_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &rawvalue_, lhs_arena,
      &other->rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &int8rawvalue_, lhs_arena,
      &other->int8rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(WeightParams, isupdatable_)
      + sizeof(WeightParams::isupdatable_)
      - PROTOBUF_FIELD_OFFSET(WeightParams, quantization_)>(
          reinterpret_cast<char*>(&quantization_),
          reinterpret_cast<char*>(&other->quantization_));
}